

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaParseUInt(xmlChar **str,unsigned_long *llo,unsigned_long *lmi,unsigned_long *lhi)

{
  bool bVar1;
  int local_60;
  int local_5c;
  int i;
  int ret;
  xmlChar *cur;
  xmlChar *tmp;
  unsigned_long hi;
  unsigned_long mi;
  unsigned_long lo;
  unsigned_long *lhi_local;
  unsigned_long *lmi_local;
  unsigned_long *llo_local;
  xmlChar **str_local;
  
  mi = 0;
  hi = 0;
  tmp = (xmlChar *)0x0;
  _i = *str;
  local_5c = 0;
  local_60 = 0;
  if ((*_i < 0x30) || (0x39 < *_i)) {
    str_local._4_4_ = -2;
  }
  else {
    for (; *_i == 0x30; _i = _i + 1) {
    }
    cur = _i;
    while( true ) {
      bVar1 = false;
      if ((*cur != '\0') && (bVar1 = false, 0x2f < *cur)) {
        bVar1 = *cur < 0x3a;
      }
      if (!bVar1) break;
      local_60 = local_60 + 1;
      cur = cur + 1;
      local_5c = local_5c + 1;
    }
    if (local_60 < 0x19) {
      for (; 0x10 < local_60; local_60 = local_60 + -1) {
        tmp = (xmlChar *)((long)tmp * 10 + (long)(int)(*_i - 0x30));
        _i = _i + 1;
      }
      for (; 8 < local_60; local_60 = local_60 + -1) {
        hi = hi * 10 + (long)(int)(*_i - 0x30);
        _i = _i + 1;
      }
      for (; 0 < local_60; local_60 = local_60 + -1) {
        mi = mi * 10 + (long)(int)(*_i - 0x30);
        _i = _i + 1;
      }
      *str = _i;
      *llo = mi;
      *lmi = hi;
      *lhi = (unsigned_long)tmp;
      str_local._4_4_ = local_5c;
    }
    else {
      *str = cur;
      str_local._4_4_ = -1;
    }
  }
  return str_local._4_4_;
}

Assistant:

static int
xmlSchemaParseUInt(const xmlChar **str, unsigned long *llo,
                   unsigned long *lmi, unsigned long *lhi) {
    unsigned long lo = 0, mi = 0, hi = 0;
    const xmlChar *tmp, *cur = *str;
    int ret = 0, i = 0;

    if (!((*cur >= '0') && (*cur <= '9')))
        return(-2);

    while (*cur == '0') {        /* ignore leading zeroes */
        cur++;
    }
    tmp = cur;
    while ((*tmp != 0) && (*tmp >= '0') && (*tmp <= '9')) {
        i++;tmp++;ret++;
    }
    if (i > 24) {
        *str = tmp;
        return(-1);
    }
    while (i > 16) {
        hi = hi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 8) {
        mi = mi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 0) {
        lo = lo * 10 + (*cur++ - '0');
        i--;
    }

    *str = cur;
    *llo = lo;
    *lmi = mi;
    *lhi = hi;
    return(ret);
}